

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O0

void Handlers::Trade_Agree(Character *character,PacketReader *reader)

{
  Character_Item CVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  list<Character_Item,_std::allocator<Character_Item>_> *this;
  reference pCVar7;
  undefined1 local_160 [8];
  PacketBuilder builder_2;
  PacketBuilder reply_1;
  PacketBuilder builder_1;
  PacketBuilder reply;
  Character_Item item_1;
  iterator __end3_1;
  iterator __begin3_1;
  list<Character_Item,_std::allocator<Character_Item>_> *__range3_1;
  Character_Item item;
  iterator __end3;
  iterator __begin3;
  list<Character_Item,_std::allocator<Character_Item>_> *__range3;
  undefined1 local_50 [8];
  PacketBuilder builder;
  int agree;
  PacketReader *reader_local;
  Character *character_local;
  
  if ((character->trading & 1U) != 0) {
    bVar2 = PacketReader::GetChar(reader);
    builder.add_size._4_4_ = (uint)bVar2;
    character->trade_agree = builder.add_size._4_4_ != 0;
    if (builder.add_size._4_4_ == 0) {
      PacketBuilder::PacketBuilder((PacketBuilder *)&builder_2.add_size,PACKET_TRADE,PACKET_SPEC,1);
      PacketBuilder::AddChar((PacketBuilder *)&builder_2.add_size,builder.add_size._4_4_);
      Character::Send(character,(PacketBuilder *)&builder_2.add_size);
      PacketBuilder::PacketBuilder((PacketBuilder *)local_160,PACKET_TRADE,PACKET_AGREE,3);
      iVar4 = Character::PlayerID(character->trade_partner);
      PacketBuilder::AddShort((PacketBuilder *)local_160,iVar4);
      PacketBuilder::AddChar((PacketBuilder *)local_160,builder.add_size._4_4_);
      Character::Send(character->trade_partner,(PacketBuilder *)local_160);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_160);
      PacketBuilder::~PacketBuilder((PacketBuilder *)&builder_2.add_size);
    }
    else {
      bVar3 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::empty
                        (&character->trade_inventory);
      if (!bVar3) {
        if ((character->trade_partner->trade_agree & 1U) == 0) {
          PacketBuilder::PacketBuilder
                    ((PacketBuilder *)&builder_1.add_size,PACKET_TRADE,PACKET_SPEC,1);
          PacketBuilder::AddChar((PacketBuilder *)&builder_1.add_size,builder.add_size._4_4_);
          Character::Send(character,(PacketBuilder *)&builder_1.add_size);
          PacketBuilder::PacketBuilder
                    ((PacketBuilder *)&reply_1.add_size,PACKET_TRADE,PACKET_AGREE,3);
          iVar4 = Character::PlayerID(character->trade_partner);
          PacketBuilder::AddShort((PacketBuilder *)&reply_1.add_size,iVar4);
          PacketBuilder::AddChar((PacketBuilder *)&reply_1.add_size,builder.add_size._4_4_);
          Character::Send(character->trade_partner,(PacketBuilder *)&reply_1.add_size);
          PacketBuilder::~PacketBuilder((PacketBuilder *)&reply_1.add_size);
          PacketBuilder::~PacketBuilder((PacketBuilder *)&builder_1.add_size);
        }
        else {
          sVar5 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                            (&character->trade_partner->trade_inventory);
          sVar6 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                            (&character->trade_inventory);
          PacketBuilder::PacketBuilder
                    ((PacketBuilder *)local_50,PACKET_TRADE,PACKET_USE,sVar6 * 6 + 6 + sVar5 * 6);
          iVar4 = Character::PlayerID(character->trade_partner);
          PacketBuilder::AddShort((PacketBuilder *)local_50,iVar4);
          this = &character->trade_partner->trade_inventory;
          __end3 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin(this);
          item = (Character_Item)
                 std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end(this);
          while (bVar3 = std::operator!=(&__end3,(_Self *)&item), bVar3) {
            pCVar7 = std::_List_iterator<Character_Item>::operator*(&__end3);
            CVar1 = *pCVar7;
            __range3_1._0_2_ = CVar1.id;
            PacketBuilder::AddShort((PacketBuilder *)local_50,(int)(short)__range3_1);
            __range3_1._4_4_ = CVar1.amount;
            PacketBuilder::AddInt((PacketBuilder *)local_50,__range3_1._4_4_);
            Character::DelItem(character->trade_partner,(short)__range3_1,__range3_1._4_4_);
            Character::AddItem(character,(short)__range3_1,__range3_1._4_4_);
            std::_List_iterator<Character_Item>::operator++(&__end3);
          }
          PacketBuilder::AddByte((PacketBuilder *)local_50,0xff);
          iVar4 = Character::PlayerID(character);
          PacketBuilder::AddShort((PacketBuilder *)local_50,iVar4);
          __end3_1 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                               (&character->trade_inventory);
          item_1 = (Character_Item)
                   std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                             (&character->trade_inventory);
          while (bVar3 = std::operator!=(&__end3_1,(_Self *)&item_1), bVar3) {
            pCVar7 = std::_List_iterator<Character_Item>::operator*(&__end3_1);
            CVar1 = *pCVar7;
            reply.add_size._0_2_ = CVar1.id;
            PacketBuilder::AddShort((PacketBuilder *)local_50,(int)(short)reply.add_size);
            reply.add_size._4_4_ = CVar1.amount;
            PacketBuilder::AddInt((PacketBuilder *)local_50,reply.add_size._4_4_);
            Character::DelItem(character,(short)reply.add_size,reply.add_size._4_4_);
            Character::AddItem(character->trade_partner,(short)reply.add_size,reply.add_size._4_4_);
            std::_List_iterator<Character_Item>::operator++(&__end3_1);
          }
          PacketBuilder::AddByte((PacketBuilder *)local_50,0xff);
          Character::Send(character,(PacketBuilder *)local_50);
          Character::Send(character->trade_partner,(PacketBuilder *)local_50);
          Character::Emote(character,EMOTE_TRADE,true);
          Character::Emote(character->trade_partner,EMOTE_TRADE,true);
          character->trading = false;
          std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                    (&character->trade_inventory);
          character->trade_agree = false;
          Character::CheckQuestRules(character);
          Character::CheckQuestRules(character->trade_partner);
          character->trade_partner->trading = false;
          std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                    (&character->trade_partner->trade_inventory);
          character->trade_agree = false;
          character->trade_partner->trade_partner = (Character *)0x0;
          character->trade_partner = (Character *)0x0;
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void Trade_Agree(Character *character, PacketReader &reader)
{
	if (!character->trading) return;

	int agree = reader.GetChar();

	character->trade_agree = agree;

	if (agree)
	{
		if (character->trade_inventory.empty())
		{
			return;
		}

		if (character->trade_partner->trade_agree)
		{
			PacketBuilder builder(PACKET_TRADE, PACKET_USE,
				6 + character->trade_partner->trade_inventory.size() * 6 + character->trade_inventory.size() * 6);

			builder.AddShort(character->trade_partner->PlayerID());
			UTIL_FOREACH(character->trade_partner->trade_inventory, item)
			{
				builder.AddShort(item.id);
				builder.AddInt(item.amount);
				character->trade_partner->DelItem(item.id, item.amount);
				character->AddItem(item.id, item.amount);
			}
			builder.AddByte(255);
			builder.AddShort(character->PlayerID());
			UTIL_FOREACH(character->trade_inventory, item)
			{
				builder.AddShort(item.id);
				builder.AddInt(item.amount);
				character->DelItem(item.id, item.amount);
				character->trade_partner->AddItem(item.id, item.amount);
			}
			builder.AddByte(255);
			character->Send(builder);
			character->trade_partner->Send(builder);

			character->Emote(EMOTE_TRADE);
			character->trade_partner->Emote(EMOTE_TRADE);

			character->trading = false;
			character->trade_inventory.clear();
			character->trade_agree = false;

			character->CheckQuestRules();
			character->trade_partner->CheckQuestRules();

			character->trade_partner->trading = false;
			character->trade_partner->trade_inventory.clear();
			character->trade_agree = false;

			character->trade_partner->trade_partner = 0;
			character->trade_partner = 0;
		}
		else
		{
			PacketBuilder reply(PACKET_TRADE, PACKET_SPEC, 1);
			reply.AddChar(agree);
			character->Send(reply);

			PacketBuilder builder(PACKET_TRADE, PACKET_AGREE, 3);
			builder.AddShort(character->trade_partner->PlayerID());
			builder.AddChar(agree);
			character->trade_partner->Send(builder);
		}
	}
	else
	{
		PacketBuilder reply(PACKET_TRADE, PACKET_SPEC, 1);
		reply.AddChar(agree);
		character->Send(reply);

		PacketBuilder builder(PACKET_TRADE, PACKET_AGREE, 3);
		builder.AddShort(character->trade_partner->PlayerID());
		builder.AddChar(agree);
		character->trade_partner->Send(builder);
	}
}